

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O2

int Assimp_Dump(char **params,uint num)

{
  char cVar1;
  bool bVar2;
  bool shortened;
  bool compressed;
  int iVar3;
  aiScene *scene;
  FILE *__stream;
  char *pcVar4;
  uint i;
  ulong uVar5;
  ImportData *in_stack_ffffffffffffff08;
  string out;
  string in;
  ImportData import;
  string cmd;
  string local_50 [32];
  
  pcVar4 = *params;
  cVar1 = *pcVar4;
  if (((((cVar1 == '-') && (pcVar4[1] == 'h')) && (pcVar4[2] == '\0')) ||
      (iVar3 = strcmp(pcVar4,"--help"), iVar3 == 0)) ||
     (((cVar1 == '-' && (pcVar4[1] == '?')) && (pcVar4[2] == '\0')))) {
    iVar3 = 0;
    printf("%s",AICMD_MSG_DUMP_HELP);
  }
  else if (num == 0) {
    puts("assimp dump: Invalid number of arguments. See \'assimp dump --help\'\r");
    iVar3 = 1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&in,pcVar4,(allocator<char> *)&import);
    if (num == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&out,"-",(allocator<char> *)&import);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&out,params[1],(allocator<char> *)&import);
    }
    cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
    cmd._M_string_length = 0;
    cmd.field_2._M_local_buf[0] = '\0';
    uVar5 = (ulong)(*out._M_dataplus._M_p != '-');
    while (uVar5 = uVar5 + 1, uVar5 < num) {
      if (params[uVar5] != (char *)0x0) {
        std::__cxx11::string::append((char *)&cmd);
        std::__cxx11::string::append((char *)&cmd);
      }
    }
    import.ppFlags = 0;
    import.showLog = false;
    import.logFile._M_dataplus._M_p = (pointer)&import.logFile.field_2;
    import.logFile._M_string_length = 0;
    import.logFile.field_2._M_local_buf[0] = '\0';
    import.verbose = false;
    import.log = false;
    ProcessStandardArguments(&import,params + 1,num - 1);
    bVar2 = false;
    shortened = false;
    compressed = false;
    for (uVar5 = 1; uVar5 < num; uVar5 = uVar5 + 1) {
      pcVar4 = params[uVar5];
      if (pcVar4 != (char *)0x0) {
        cVar1 = *pcVar4;
        if ((((cVar1 == '-') && (pcVar4[1] == 'b')) && (pcVar4[2] == '\0')) ||
           (iVar3 = strcmp(pcVar4,"--binary"), iVar3 == 0)) {
          bVar2 = true;
        }
        else if ((((cVar1 == '-') && (pcVar4[1] == 's')) && (pcVar4[2] == '\0')) ||
                (iVar3 = strcmp(pcVar4,"--short"), iVar3 == 0)) {
          shortened = true;
        }
        else if ((((cVar1 == '-') && (pcVar4[1] == 'z')) && (pcVar4[2] == '\0')) ||
                (iVar3 = strcmp(pcVar4,"--compressed"), iVar3 == 0)) {
          compressed = true;
        }
      }
    }
    if (*out._M_dataplus._M_p == '-') {
      std::__cxx11::string::rfind((char)&in,0x2e);
      std::__cxx11::string::substr((ulong)local_50,(ulong)&in);
      std::__cxx11::string::operator=((string *)&out,local_50);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::append((char *)&out);
      if ((bool)(shortened & bVar2)) {
        std::__cxx11::string::append((char *)&out);
      }
    }
    scene = ImportModel(&import,&in);
    if (scene == (aiScene *)0x0) {
      printf("assimp dump: Unable to load input file %s\n",in._M_dataplus._M_p);
      iVar3 = 5;
    }
    else {
      pcVar4 = "wt";
      if (bVar2) {
        pcVar4 = "wb";
      }
      __stream = fopen(out._M_dataplus._M_p,pcVar4);
      if (__stream == (FILE *)0x0) {
        printf("assimp dump: Unable to open output file %s\n",out._M_dataplus._M_p);
        iVar3 = 0xc;
      }
      else {
        if (bVar2) {
          WriteBinaryDump(scene,(FILE *)__stream,in._M_dataplus._M_p,cmd._M_dataplus._M_p,shortened,
                          compressed,in_stack_ffffffffffffff08);
        }
        else {
          WriteDump(scene,(FILE *)__stream,in._M_dataplus._M_p,cmd._M_dataplus._M_p,shortened);
        }
        fclose(__stream);
        if ((bool)(compressed & bVar2)) {
          CompressBinaryDump(out._M_dataplus._M_p,0x200);
        }
        iVar3 = 0;
        printf("assimp dump: Wrote output dump %s\n",out._M_dataplus._M_p);
      }
    }
    std::__cxx11::string::~string((string *)&import.logFile);
    std::__cxx11::string::~string((string *)&cmd);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::~string((string *)&in);
  }
  return iVar3;
}

Assistant:

int Assimp_Dump (const char* const* params, unsigned int num)
{
	const char* fail = "assimp dump: Invalid number of arguments. "
			"See \'assimp dump --help\'\r\n";

	// --help
	if (!strcmp( params[0], "-h") || !strcmp( params[0], "--help") || !strcmp( params[0], "-?") ) {
		printf("%s",AICMD_MSG_DUMP_HELP);
		return 0;
	}

	// asssimp dump in out [options]
	if (num < 1) {
		printf("%s", fail);
		return 1;
	}

	std::string in  = std::string(params[0]);
	std::string out = (num > 1 ? std::string(params[1]) : std::string("-"));

	// store full command line
	std::string cmd;
	for (unsigned int i = (out[0] == '-' ? 1 : 2); i < num;++i)	{
		if (!params[i])continue;
		cmd.append(params[i]);
		cmd.append(" ");
	}

	// get import flags
	ImportData import;
	ProcessStandardArguments(import,params+1,num-1);

	bool binary = false, shortened = false,compressed=false;
	
	// process other flags
	for (unsigned int i = 1; i < num;++i)		{
		if (!params[i])continue;
		if (!strcmp( params[i], "-b") || !strcmp( params[i], "--binary")) {
			binary = true;
		}
		else if (!strcmp( params[i], "-s") || !strcmp( params[i], "--short")) {
			shortened = true;
		}
		else if (!strcmp( params[i], "-z") || !strcmp( params[i], "--compressed")) {
			compressed = true;
		}
#if 0
		else if (i > 2 || params[i][0] == '-') {
			::printf("Unknown parameter: %s\n",params[i]);
			return 10;
		}
#endif
	}

	if (out[0] == '-') {
		// take file name from input file
		std::string::size_type s = in.find_last_of('.');
		if (s == std::string::npos) {
			s = in.length();
		}

		out = in.substr(0,s);
		out.append((binary ? ".assbin" : ".assxml"));
		if (shortened && binary) {
			out.append(".regress");
		}
	}

	// import the main model
	const aiScene* scene = ImportModel(import,in);
	if (!scene) {
		printf("assimp dump: Unable to load input file %s\n",in.c_str());
		return 5;
	}

	// open the output file and build the dump
	FILE* o = ::fopen(out.c_str(),(binary ? "wb" : "wt"));
	if (!o) {
		printf("assimp dump: Unable to open output file %s\n",out.c_str());
		return 12;
	}

	if (binary) {
		WriteBinaryDump (scene,o,in.c_str(),cmd.c_str(),shortened,compressed,import);
	}
	else WriteDump (scene,o,in.c_str(),cmd.c_str(),shortened);
	fclose(o);

	if (compressed && binary) {
		CompressBinaryDump(out.c_str(),ASSBIN_HEADER_LENGTH);
	}

	printf("assimp dump: Wrote output dump %s\n",out.c_str());
	return 0;
}